

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

opj_bool opj_set_decode_area(opj_codec_t *p_codec,opj_image_t *p_image,OPJ_INT32 p_start_x,
                            OPJ_INT32 p_start_y,OPJ_INT32 p_end_x,OPJ_INT32 p_end_y)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  opj_codec_private_t *l_info;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else if (*(int *)(in_RDI + 0x60) == 0) {
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x38))
                        (*(undefined8 *)(in_RDI + 0x50),in_RSI,in_EDX,in_ECX,in_R8D,in_R9D,
                         *(undefined8 *)(in_RDI + 0x58));
  }
  return local_4;
}

Assistant:

opj_bool OPJ_CALLCONV opj_set_decode_area(	opj_codec_t *p_codec,
											opj_image_t* p_image,
											OPJ_INT32 p_start_x, OPJ_INT32 p_start_y,
											OPJ_INT32 p_end_x, OPJ_INT32 p_end_y
											)
{
	if (p_codec) {
		opj_codec_private_t * l_info = (opj_codec_private_t *) p_codec;
		if (! l_info->is_decompressor) {
			return OPJ_FALSE;
		}

		return  l_info->m_codec_data.m_decompression.opj_set_decode_area(	l_info->m_codec,
																			p_image,
																			p_start_x, p_start_y,
																			p_end_x, p_end_y,
																			l_info->m_event_mgr);

	}
	return OPJ_FALSE;
}